

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

bool __thiscall QPixmapStyle::eventFilter(QPixmapStyle *this,QObject *watched,QEvent *event)

{
  long lVar1;
  QWidgetData *pQVar2;
  undefined1 uVar3;
  int iVar4;
  QWidget *pQVar5;
  QAbstractItemView *pQVar6;
  long lVar7;
  char *pcVar8;
  QPoint QVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QRect local_a8;
  anon_union_24_3_e3d07ef4_for_data local_90;
  anon_union_24_3_e3d07ef4_for_data local_70;
  int local_4c;
  int local_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QSlider::staticMetaObject);
  if (((pQVar5 != (QWidget *)0x0) && (*(ushort *)(event + 8) < 6)) &&
     ((0x2cU >> (*(ushort *)(event + 8) & 0x1f) & 1) != 0)) {
    QWidget::update(pQVar5);
  }
  pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (pQVar5 != (QWidget *)0x0) {
    if (*(short *)(event + 8) == 3) {
      ::QVariant::QVariant((QVariant *)&local_70,false);
      QObject::doSetProperty
                ((char *)pQVar5,(QVariant *)"_pixmapstyle_combobox_pressed",(QVariant *)&local_70);
      ::QVariant::~QVariant((QVariant *)&local_70);
      QWidget::repaint(pQVar5);
      pQVar6 = QComboBox::view((QComboBox *)pQVar5);
      if (pQVar6 != (QAbstractItemView *)0x0) {
        pQVar6 = QComboBox::view((QComboBox *)pQVar5);
        lVar7 = 0x1b0;
        if ((((pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
             widget_attributes & 0x8000) == 0) {
          lVar7 = (ulong)((byte)pQVar5->data->widget_attributes & 1) * 8 + 0x1a8;
        }
        (**(code **)(*(long *)pQVar5 + lVar7))(pQVar5);
      }
    }
    else if (*(short *)(event + 8) == 2) {
      event[0xc] = (QEvent)0x0;
      ::QVariant::QVariant((QVariant *)&local_70,true);
      QObject::doSetProperty
                ((char *)pQVar5,(QVariant *)"_pixmapstyle_combobox_pressed",(QVariant *)&local_70);
      ::QVariant::~QVariant((QVariant *)&local_70);
      QWidget::repaint(pQVar5);
      uVar3 = 1;
      goto LAB_00344af8;
    }
  }
  (*(code *)**(undefined8 **)watched)(watched);
  pcVar8 = (char *)QMetaObject::className();
  iVar4 = qstrcmp(pcVar8,"QComboBoxPrivateContainer");
  if ((iVar4 == 0) && (*(short *)(event + 8) == 0x11)) {
    pQVar5 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)(watched + 8) + 0x30) & 1) != 0) {
      pQVar5 = (QWidget *)watched;
    }
    iVar4 = (pQVar5->data->crect).y1.m_i;
    local_70.shared = (PrivateShared *)0x0;
    QVar9 = QWidget::mapToGlobal
                      (*(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10),(QPoint *)&local_70.shared)
    ;
    pQVar2 = pQVar5->data;
    local_a8.x1.m_i = (pQVar2->crect).x1.m_i;
    local_a8.y1.m_i = (pQVar2->crect).y1.m_i;
    local_a8.x2.m_i = (pQVar2->crect).x2.m_i;
    local_a8.y2.m_i = (pQVar2->crect).y2.m_i;
    local_90._0_4_ = 0x1c;
    QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
              ((QPixmapStyleDescriptor *)&local_70,
               (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar1 + 0xe8),
               (ControlDescriptor *)local_90.data);
    RVar10 = QVar9.yp.m_i;
    if (RVar10.m_i <= iVar4) {
      local_4c = -local_44;
    }
    local_a8.y2.m_i = local_a8.y2.m_i + local_4c;
    local_a8.y1.m_i = local_a8.y1.m_i + local_4c;
    QWidget::setGeometry(pQVar5,&local_a8);
    ::QVariant::QVariant((QVariant *)&local_90,iVar4 < RVar10.m_i);
    QObject::doSetProperty
              ((char *)pQVar5,(QVariant *)"_pixmapstyle_combobox_up",(QVariant *)&local_90);
    ::QVariant::~QVariant((QVariant *)&local_90);
    pcVar8 = *(char **)(*(long *)&pQVar5->field_0x8 + 0x10);
    ::QVariant::QVariant((QVariant *)&local_90,iVar4 < RVar10.m_i);
    QObject::doSetProperty(pcVar8,(QVariant *)"_pixmapstyle_combobox_up",(QVariant *)&local_90);
    ::QVariant::~QVariant((QVariant *)&local_90);
    if ((QArrayData *)local_70.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_70.shared = *(int *)local_70.shared + -1;
      UNLOCK();
      if (*(int *)local_70.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_70.shared,2,0x10);
      }
    }
  }
  uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
LAB_00344af8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QPixmapStyle::eventFilter(QObject *watched, QEvent *event)
{
    Q_D(QPixmapStyle);
#if QT_CONFIG(slider)
    if (QSlider *slider = qobject_cast<QSlider*>(watched)) {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseMove:
            slider->update();
            break;
        default: ;
        }
    }
#endif // QT_CONFIG(slider)
#if QT_CONFIG(combobox)
    if (QComboBox *comboBox = qobject_cast<QComboBox*>(watched)) {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
            event->ignore();
            comboBox->setProperty("_pixmapstyle_combobox_pressed", true);
            comboBox->repaint();
            return true;
        case QEvent::MouseButtonRelease:
            comboBox->setProperty("_pixmapstyle_combobox_pressed", false);
            comboBox->repaint();
            if ( comboBox->view() ) {
                if ( comboBox->view()->isVisible() || (!comboBox->isEnabled()))
                    comboBox->hidePopup();
                else
                    comboBox->showPopup();
            }
            break;
        default: ;
        }
    }
#endif // QT_CONFIG(combobox)

    if (qstrcmp(watched->metaObject()->className(),"QComboBoxPrivateContainer") == 0) {
        if (event->type() == QEvent::Show) {
            QWidget *widget = qobject_cast<QWidget*>(watched);
            int yPopup = widget->geometry().top();
            int yCombo = widget->parentWidget()->mapToGlobal(QPoint(0, 0)).y();
            QRect geom = widget->geometry();
            const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);
            const bool up = yPopup < yCombo;
            geom.moveTop(geom.top() + (up ? desc.margins.top() : -desc.margins.bottom()));
            widget->setGeometry(geom);
            widget->setProperty("_pixmapstyle_combobox_up", up);
            widget->parentWidget()->setProperty("_pixmapstyle_combobox_up", up);
        }
    }

    return QCommonStyle::eventFilter(watched, event);
}